

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry_p.h
# Opt level: O0

void __thiscall QFileSystemEntry::clear(QFileSystemEntry *this)

{
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *this_00;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_40;
  QFileSystemEntry(this_00);
  operator=(this_00,in_RDI);
  ~QFileSystemEntry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear()
    {
        *this = QFileSystemEntry();
    }